

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  LogMessage local_68;
  Voidify local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ArrayOutputStream *pAStack_10;
  int count_local;
  ArrayOutputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pAStack_10 = this;
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(count);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(this->last_returned_size_);
  local_20 = absl::lts_20250127::log_internal::Check_LEImpl
                       (iVar1,iVar2,"count <= last_returned_size_");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x76,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [58])
                               "BackUp() can not exceed the size of the last Next() call.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_50 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,iVar2,"count >= 0");
  if (local_50 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_50);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x78,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  this->position_ = this->position_ - absl_log_internal_check_op_result._4_4_;
  this->last_returned_size_ = this->last_returned_size_ - absl_log_internal_check_op_result._4_4_;
  return;
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  ABSL_CHECK_LE(count, last_returned_size_)
      << "BackUp() can not exceed the size of the last Next() call.";
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ -= count;
}